

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O0

int nv_cksum(uint8_t *data,uint length)

{
  char local_21;
  uint local_20;
  uint8_t sum;
  int i;
  uint length_local;
  uint8_t *data_local;
  
  local_21 = '\0';
  for (local_20 = 0; local_20 < length; local_20 = local_20 + 1) {
    local_21 = local_21 + data[(int)local_20];
  }
  if (local_21 == '\0') {
    data_local._4_4_ = 1;
  }
  else {
    fprintf(_stderr,"Invalid checksum. Broken vbios or broken retrieval method?\n");
    data_local._4_4_ = -1;
  }
  return data_local._4_4_;
}

Assistant:

static int nv_cksum(const uint8_t *data, unsigned int length)
{
	/*
	 * There's a few checksums in the BIOS, so here's a generic checking
	 * function.
	 */
	int i;
	uint8_t sum = 0;

	for (i = 0; i < length; i++)
		sum += data[i];

	if (sum) {
		fprintf(stderr, "Invalid checksum. Broken vbios or broken retrieval method?\n");
		return ECRC;
	}
	return EOK;
}